

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_gid_gname.c
# Opt level: O2

void test_option_gid_gname(void)

{
  wchar_t wVar1;
  char *pcVar2;
  char *pcVar3;
  size_t s;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                  ,L'\x0e',L'\0');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'\x0f',"file",L'Ƥ',L'\xffffffff',"1234567890");
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'\x15',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L'\x16',"stdout1.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L'\x17',"stderr1.txt");
  pcVar2 = slurpfile(&s,"archive1");
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive2 --gid=17 --gname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt"
                  ,testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'\x1e',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive2 --gid=17 --gname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L'\x1f',"stdout2.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L' ',"stderr2.txt");
  pcVar3 = slurpfile(&s,"archive2");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'#',pcVar3 + 0x74,"data + 116","000021 ","\"000021 \\0\"",8,"8",(void *)0x0)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'$',pcVar3 + 0x129,"data + 297","foofoofoo","\"foofoofoo\\0\"",10,"10",
                      (void *)0x0);
  free(pcVar3);
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive4 --gname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",
                  testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'+',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive4 --gname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L',',"stdout4.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L'-',"stderr4.txt");
  pcVar3 = slurpfile(&s,"archive4");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'0',pcVar3 + 0x74,"data + 116",pcVar2 + 0x74,"reference + 116",8,"8",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'1',pcVar3 + 0x129,"data + 297","foofoofoo","\"foofoofoo\\0\"",10,"10",
                      (void *)0x0);
  free(pcVar3);
  free(pcVar2);
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive3 --gid=17 --gname= --format=ustar file >stdout3.txt 2>stderr3.txt",
                  testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'9',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive3 --gid=17 --gname= --format=ustar file >stdout3.txt 2>stderr3.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L':',"stdout3.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
             ,L';',"stderr3.txt");
  pcVar2 = slurpfile(&s,"archive3");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'=',pcVar2 + 0x74,"data + 116","000021 ","\"000021 \\0\"",8,"8",(void *)0x0)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_gid_gname.c"
                      ,L'?',pcVar2 + 0x129,"data + 297","","\"\\0\"",1,"1",(void *)0x0);
  free(pcVar2);
  return;
}

Assistant:

DEFINE_TEST(test_option_gid_gname)
{
	char *reference, *data;
	size_t s;

	assertUmask(0);
	assertMakeFile("file", 0644, "1234567890");

	/* Create archive with no special options. */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",
		testprog));
	assertEmptyFile("stdout1.txt");
	assertEmptyFile("stderr1.txt");
	reference = slurpfile(&s, "archive1");

	/* Again with both --gid and --gname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive2 --gid=17 --gname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt",
		testprog));
	assertEmptyFile("stdout2.txt");
	assertEmptyFile("stderr2.txt");
	data = slurpfile(&s, "archive2");
	/* Should force gid and gname fields in ustar header. */
	assertEqualMem(data + 116, "000021 \0", 8);
	assertEqualMem(data + 297, "foofoofoo\0", 10);
	free(data);

	/* Again with just --gname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive4 --gname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",
		testprog));
	assertEmptyFile("stdout4.txt");
	assertEmptyFile("stderr4.txt");
	data = slurpfile(&s, "archive4");
	/* Gid should be unchanged from original reference. */
	assertEqualMem(data + 116, reference + 116, 8);
	assertEqualMem(data + 297, "foofoofoo\0", 10);
	free(data);
	free(reference);

	/* Again with --gid  and force gname to empty. */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive3 --gid=17 --gname= --format=ustar file >stdout3.txt 2>stderr3.txt",
		testprog));
	assertEmptyFile("stdout3.txt");
	assertEmptyFile("stderr3.txt");
	data = slurpfile(&s, "archive3");
	assertEqualMem(data + 116, "000021 \0", 8);
	/* Gname field in ustar header should be empty. */
	assertEqualMem(data + 297, "\0", 1);
	free(data);

	/* TODO: It would be nice to verify that --gid= by itself
	 * will look up the associated gname and use that, but
	 * that requires some system-specific code. */

	/* TODO: It would be nice to verify that --gid= will
	 * leave the gname field blank if the specified gid
	 * isn't used on the local system. */
}